

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_close(PHYSFS_File *_handle)

{
  int iVar1;
  
  __PHYSFS_platformGrabMutex(stateLock);
  iVar1 = closeHandleInOpenList(&openReadList,(FileHandle *)_handle);
  if (iVar1 == -1) {
    __PHYSFS_platformReleaseMutex(stateLock);
    return 0;
  }
  if (iVar1 == 0) {
    iVar1 = closeHandleInOpenList(&openWriteList,(FileHandle *)_handle);
    __PHYSFS_platformReleaseMutex(stateLock);
    if (iVar1 == -1) {
      return 0;
    }
    if (iVar1 == 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
      return 0;
    }
  }
  else {
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return 1;
}

Assistant:

int PHYSFS_close(PHYSFS_File *_handle)
{
    FileHandle *handle = (FileHandle *) _handle;
    int rc;

    __PHYSFS_platformGrabMutex(stateLock);

    /* -1 == close failure. 0 == not found. 1 == success. */
    rc = closeHandleInOpenList(&openReadList, handle);
    BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    if (!rc)
    {
        rc = closeHandleInOpenList(&openWriteList, handle);
        BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    BAIL_IF(!rc, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    return 1;
}